

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_helpers.hpp
# Opt level: O0

void duckdb::AddToHugeint::AddConstant<duckdb::SumState<duckdb::hugeint_t>,int>
               (SumState<duckdb::hugeint_t> *state,int input,idx_t count)

{
  unsigned_long uVar1;
  ulong in_RDX;
  int in_ESI;
  long in_RDI;
  hugeint_t addition;
  idx_t i;
  uint64_t value;
  hugeint_t local_58;
  unsigned_long in_stack_ffffffffffffffc0;
  hugeint_t local_38;
  ulong local_28;
  uint64_t local_20;
  ulong local_18;
  int local_c;
  long local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  if ((in_ESI < 0) ||
     (uVar1 = NumericLimits<unsigned_long>::Maximum(), uVar1 >> 0xb <= (ulong)(long)in_ESI)) {
    if (local_18 < 8) {
      for (local_28 = 0; local_28 < local_18; local_28 = local_28 + 1) {
        AddValue((hugeint_t *)(local_8 + 8),(long)local_c,(uint)(-1 < local_c));
      }
    }
    else {
      duckdb::hugeint_t::hugeint_t((hugeint_t *)&stack0xffffffffffffffb8,(long)local_c);
      local_58 = Hugeint::Convert<unsigned_long>(in_stack_ffffffffffffffc0);
      local_38 = (hugeint_t)
                 duckdb::hugeint_t::operator*((hugeint_t *)&stack0xffffffffffffffb8,&local_58);
      duckdb::hugeint_t::operator+=((hugeint_t *)(local_8 + 8),&local_38);
    }
  }
  else {
    local_20 = (long)local_c * local_18;
    AddValue((hugeint_t *)(local_8 + 8),local_20,1);
  }
  return;
}

Assistant:

static void AddConstant(STATE &state, T input, idx_t count) {
		// add a constant X number of times
		// fast path: check if value * count fits into a uint64_t
		// note that we check if value * VECTOR_SIZE fits in a uint64_t to avoid having to actually do a division
		// this is still a pretty high number (18014398509481984) so most positive numbers will fit
		if (input >= 0 && uint64_t(input) < (NumericLimits<uint64_t>::Maximum() / STANDARD_VECTOR_SIZE)) {
			// if it does just multiply it and add the value
			uint64_t value = uint64_t(input) * count;
			AddValue(state.value, value, 1);
		} else {
			// if it doesn't fit we have two choices
			// either we loop over count and add the values individually
			// or we convert to a hugeint and multiply the hugeint
			// the problem is that hugeint multiplication is expensive
			// hence we switch here: with a low count we do the loop
			// with a high count we do the hugeint multiplication
			if (count < 8) {
				for (idx_t i = 0; i < count; i++) {
					AddValue(state.value, uint64_t(input), input >= 0);
				}
			} else {
				hugeint_t addition = hugeint_t(input) * Hugeint::Convert(count);
				state.value += addition;
			}
		}
	}